

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_cut(_glist *x)

{
  char *x_00;
  void *data;
  int local_1c;
  int bufsize;
  char *buf;
  _glist *x_local;
  
  if (x->gl_editor != (t_editor *)0x0) {
    buf = (char *)x;
    if (((byte)x->gl_editor->field_0x88 >> 5 & 1) == 0) {
      if (x->gl_editor->e_textedfor == (_rtext *)0x0) {
        if (x->gl_editor->e_selection == (t_selection *)0x0) {
          return;
        }
      }
      else {
        rtext_getseltext(x->gl_editor->e_textedfor,(char **)&stack0xffffffffffffffe8,&local_1c);
        if (((local_1c != 0) || (*(long *)(*(long *)(buf + 0xc0) + 0x20) == 0)) ||
           (*(long *)(*(long *)(*(long *)(buf + 0xc0) + 0x20) + 8) != 0)) {
          canvas_copy((_glist *)buf);
          rtext_key(*(_rtext **)(*(long *)(buf + 0xc0) + 0x28),0x7f,&s_);
          canvas_dirty((_glist *)buf,1.0);
          return;
        }
        *(undefined8 *)(*(long *)(buf + 0xc0) + 0x28) = 0;
      }
      x_00 = buf;
      data = canvas_undo_set_cut((_glist *)buf,1);
      canvas_undo_add((_glist *)x_00,UNDO_CUT,"cut",data);
      canvas_copy((_glist *)buf);
      canvas_doclear((_glist *)buf);
      pdgui_vmess("pdtk_canvas_getscroll","c",buf);
    }
    else {
      canvas_clearline(x);
    }
  }
  return;
}

Assistant:

static void canvas_cut(t_canvas *x)
{
    if (!x->gl_editor)  /* ignore if invisible */
        return;
    if (x->gl_editor->e_selectedline)   /* delete line */
        canvas_clearline(x);
    else if (x->gl_editor->e_textedfor) /* delete selected text in a box */
    {
        char *buf;
        int bufsize;
        rtext_getseltext(x->gl_editor->e_textedfor, &buf, &bufsize);
        if (!bufsize && x->gl_editor->e_selection &&
            !x->gl_editor->e_selection->sel_next)
        {
                /* if the text is already empty, delete the box.  We
                   first clear 'textedfor' so that canvas_doclear later will
                   think the whole box was selected, not the text */
            x->gl_editor->e_textedfor = 0;
            goto deleteobj;
        }
        canvas_copy(x);
        rtext_key(x->gl_editor->e_textedfor, 127, &s_);
        canvas_dirty(x, 1);
    }
    else if (x->gl_editor->e_selection)
    {
    deleteobj:      /* delete one or more objects */
        canvas_undo_add(x, UNDO_CUT, "cut", canvas_undo_set_cut(x, UCUT_CUT));
        canvas_copy(x);
        canvas_doclear(x);
        pdgui_vmess("pdtk_canvas_getscroll", "c", x);
    }
}